

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

bool __thiscall OpenMD::FragmentStamp::addAtomStamp(FragmentStamp *this,AtomStamp *atom)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  OpenMDException *this_00;
  ostringstream oss;
  string local_1b8;
  ostringstream local_198 [376];
  
  bVar2 = addIndexSensitiveStamp<std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>,OpenMD::AtomStamp>
                    (this,&this->atomStamps_,atom);
  if (bVar2) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Error in Fragment ",0x12)
  ;
  pcVar1 = (this->Name).data_._M_dataplus._M_p;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,": multiple atoms have the same indices",0x26);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,atom->index_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1b8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

bool FragmentStamp::addAtomStamp(AtomStamp* atom) {
    bool ret = addIndexSensitiveStamp(atomStamps_, atom);
    if (!ret) {
      std::ostringstream oss;
      oss << "Error in Fragment " << getName()
          << ": multiple atoms have the same indices" << atom->getIndex()
          << "\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }